

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::Dump(Node *this,StreamWriterLE *outstream,bool binary,int indent)

{
  undefined7 in_register_00000011;
  ostringstream ss;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  if ((int)CONCAT71(in_register_00000011,binary) != 0) {
    DumpBinary(this,outstream);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  DumpAscii(this,(ostream *)local_198,indent);
  std::__cxx11::stringbuf::str();
  StreamWriter<false,_false>::PutString(outstream,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void FBX::Node::Dump(
    Assimp::StreamWriterLE &outstream,
    bool binary, int indent
) {
    if (binary) {
        DumpBinary(outstream);
    } else {
        std::ostringstream ss;
        DumpAscii(ss, indent);
        outstream.PutString(ss.str());
    }
}